

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_kotlin.cpp
# Opt level: O0

string * __thiscall
flatbuffers::kotlin::KotlinGenerator::LiteralSuffix_abi_cxx11_
          (string *__return_storage_ptr__,KotlinGenerator *this,BaseType type)

{
  allocator<char> local_27;
  allocator<char> local_26;
  allocator<char> local_25 [16];
  allocator<char> local_15;
  int local_14;
  string *psStack_10;
  BaseType type_local;
  
  local_14 = (int)this;
  psStack_10 = __return_storage_ptr__;
  if ((((local_14 == 1) || (local_14 == 4)) || (local_14 == 6)) || (local_14 == 8)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"u",&local_15);
    std::allocator<char>::~allocator(&local_15);
  }
  else if (local_14 == 9) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"L",&local_26);
    std::allocator<char>::~allocator(&local_26);
  }
  else if (local_14 == 10) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"UL",local_25);
    std::allocator<char>::~allocator(local_25);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"",&local_27);
    std::allocator<char>::~allocator(&local_27);
  }
  return __return_storage_ptr__;
}

Assistant:

static std::string LiteralSuffix(const BaseType type) {
    switch (type) {
      case BASE_TYPE_UINT:
      case BASE_TYPE_UCHAR:
      case BASE_TYPE_UTYPE:
      case BASE_TYPE_USHORT: return "u";
      case BASE_TYPE_ULONG: return "UL";
      case BASE_TYPE_LONG: return "L";
      default: return "";
    }
  }